

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_delete(re_context *ctx)

{
  re_reset(ctx);
  if (ctx->tuple_arr != (re_tuple *)0x0) {
    free(ctx->tuple_arr);
    ctx->tuple_arr = (re_tuple *)0x0;
  }
  if (ctx->strbuf != (char *)0x0) {
    free(ctx->strbuf);
    ctx->strbuf = (char *)0x0;
  }
  return;
}

Assistant:

void re_delete(re_context *ctx)
{
    /* reset state */
    re_reset(ctx);
    
    /* if we've allocated an array, delete it */
    if (ctx->tuple_arr != 0)
    {
        mchfre(ctx->tuple_arr);
        ctx->tuple_arr = 0;
    }

    /* if we allocated a string buffer, delete it */
    if (ctx->strbuf != 0)
    {
        mchfre(ctx->strbuf);
        ctx->strbuf = 0;
    }
}